

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem.cpp
# Opt level: O1

void __thiscall
QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsItemPrivate *this,QGraphicsTransform *t)

{
  undefined1 *puVar1;
  void *pvVar2;
  long *plVar3;
  TransformData *pTVar4;
  long lVar5;
  qreal *pqVar6;
  TransformData *pTVar7;
  TransformData *pTVar8;
  long in_FS_OFFSET;
  byte bVar9;
  QGraphicsTransform *local_28;
  TransformData *local_20;
  
  bVar9 = 0;
  pTVar4 = *(TransformData **)(in_FS_OFFSET + 0x28);
  local_20 = pTVar4;
  if (this->transformData == (TransformData *)0x0) {
    pTVar4 = (TransformData *)operator_new(0x90);
    pqVar6 = (qreal *)&DAT_00700e28;
    pTVar7 = pTVar4;
    for (lVar5 = 9; lVar5 != 0; lVar5 = lVar5 + -1) {
      (pTVar7->transform).m_matrix[0][0] = *pqVar6;
      pqVar6 = pqVar6 + (ulong)bVar9 * -2 + 1;
      pTVar7 = (TransformData *)((long)pTVar7 + (ulong)bVar9 * -0x10 + 8);
    }
    puVar1 = &(pTVar4->transform).field_0x48;
    *(ushort *)puVar1 = *(ushort *)puVar1 & 0xfc00;
    pTVar4->scale = 1.0;
    pTVar4->rotation = 0.0;
    pTVar4->xOrigin = 0.0;
    pTVar4->yOrigin = 0.0;
    (pTVar4->graphicsTransforms).d.d = (Data *)0x0;
    (pTVar4->graphicsTransforms).d.ptr = (QGraphicsTransform **)0x0;
    (pTVar4->graphicsTransforms).d.size = 0;
    pTVar4->onlyTransform = true;
    this->transformData = pTVar4;
  }
  pTVar7 = this->transformData;
  lVar5 = (pTVar7->graphicsTransforms).d.size;
  if (lVar5 != 0) {
    pTVar8 = (TransformData *)0xfffffffffffffff8;
    do {
      pvVar2 = (void *)(lVar5 * -8 + (long)pTVar8);
      if (pvVar2 == (void *)0xfffffffffffffff8) goto LAB_005eb05b;
      pTVar4 = (TransformData *)((pTVar8->transform).m_matrix[0] + 1);
      plVar3 = (long *)((long)((pTVar7->graphicsTransforms).d.ptr + 1) + (long)pTVar8);
      pTVar8 = pTVar4;
    } while ((QGraphicsTransform *)*plVar3 != t);
    pTVar4 = (TransformData *)((long)pTVar4 >> 3);
LAB_005eb05b:
    if (pvVar2 != (void *)0xfffffffffffffff8) goto LAB_005eb068;
  }
  pTVar4 = (TransformData *)0xffffffffffffffff;
LAB_005eb068:
  if (pTVar4 == (TransformData *)0xffffffffffffffff) {
    local_28 = t;
    QtPrivate::QPodArrayOps<QGraphicsTransform*>::emplace<QGraphicsTransform*&>
              ((QPodArrayOps<QGraphicsTransform*> *)&pTVar7->graphicsTransforms,lVar5,&local_28);
    QList<QGraphicsTransform_*>::end(&pTVar7->graphicsTransforms);
  }
  QGraphicsTransformPrivate::setItem(*(QGraphicsTransformPrivate **)&t->field_0x8,this->q_ptr);
  this->transformData->onlyTransform = false;
  this->field_0x166 = this->field_0x166 | 0x20;
  (*this->_vptr_QGraphicsItemPrivate[4])(this);
  if (*(TransformData **)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsItemPrivate::appendGraphicsTransform(QGraphicsTransform *t)
{
    if (!transformData)
        transformData = new QGraphicsItemPrivate::TransformData;
    if (!transformData->graphicsTransforms.contains(t))
        transformData->graphicsTransforms.append(t);

    Q_Q(QGraphicsItem);
    t->d_func()->setItem(q);
    transformData->onlyTransform = false;
    dirtySceneTransform = 1;
    transformChanged();
}